

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QLocalePrivate>::~QSharedDataPointer(QSharedDataPointer<QLocalePrivate> *this)

{
  QBasicAtomicInt *pQVar1;
  QLocalePrivate *pQVar2;
  
  pQVar2 = (this->d).ptr;
  if (pQVar2 != (QLocalePrivate *)0x0) {
    LOCK();
    pQVar1 = &pQVar2->ref;
    (pQVar1->_q_value).super___atomic_base<int>._M_i =
         (pQVar1->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->_q_value).super___atomic_base<int>._M_i == 0) {
      operator_delete((this->d).ptr,0x20);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }